

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

void QUtil::read_file_into_memory(char *filename,shared_ptr<char> *file_buf,size_t *size)

{
  element_type *peVar1;
  int iVar2;
  FILE *__stream;
  unsigned_long uVar3;
  size_t sVar4;
  runtime_error *this;
  int length;
  QUtil *this_00;
  QUtil *pQVar5;
  allocator<char> local_139;
  FileCloser fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __stream = (FILE *)safe_fopen(filename,"rb");
  fc.f = (FILE *)__stream;
  fseek(__stream,0,2);
  local_130._M_dataplus._M_p = (pointer)ftello(__stream);
  uVar3 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                    ((longlong *)&local_130);
  *size = uVar3;
  fseek(__stream,0,0);
  make_shared_array<char>((QUtil *)&local_130,*size);
  std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&file_buf->super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length);
  peVar1 = (file_buf->super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pQVar5 = (QUtil *)0x0;
  do {
    this_00 = pQVar5;
    sVar4 = fread(this_00 + (long)peVar1,1,*size - (long)this_00,__stream);
    pQVar5 = this_00 + sVar4;
  } while (sVar4 != 0);
  if (this_00 == (QUtil *)*size) {
    FileCloser::~FileCloser(&fc);
    return;
  }
  iVar2 = ferror(__stream);
  length = (int)pQVar5;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  if (iVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"premature eof reading file ",&local_139);
    std::operator+(&local_b0,&local_d0,filename);
    std::operator+(&local_90,&local_b0," into memory: read ");
    uint_to_string_abi_cxx11_(&local_f0,this_00,0,length);
    std::operator+(&local_70,&local_90,&local_f0);
    std::operator+(&local_50,&local_70,"; wanted ");
    uint_to_string_abi_cxx11_(&local_110,(QUtil *)*size,0,length);
    std::operator+(&local_130,&local_50,&local_110);
    std::runtime_error::runtime_error(this,(string *)&local_130);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"failure reading file ",&local_139);
  std::operator+(&local_b0,&local_d0,filename);
  std::operator+(&local_90,&local_b0," into memory: read ");
  uint_to_string_abi_cxx11_(&local_f0,this_00,0,length);
  std::operator+(&local_70,&local_90,&local_f0);
  std::operator+(&local_50,&local_70,"; wanted ");
  uint_to_string_abi_cxx11_(&local_110,(QUtil *)*size,0,length);
  std::operator+(&local_130,&local_50,&local_110);
  std::runtime_error::runtime_error(this,(string *)&local_130);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QUtil::read_file_into_memory(char const* filename, std::shared_ptr<char>& file_buf, size_t& size)
{
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    fseek(f, 0, SEEK_END);
    size = QIntC::to_size(QUtil::tell(f));
    fseek(f, 0, SEEK_SET);
    file_buf = QUtil::make_shared_array<char>(size);
    char* buf_p = file_buf.get();
    size_t bytes_read = 0;
    size_t len = 0;
    while ((len = fread(buf_p + bytes_read, 1, size - bytes_read, f)) > 0) {
        bytes_read += len;
    }
    if (bytes_read != size) {
        if (ferror(f)) {
            throw std::runtime_error(
                std::string("failure reading file ") + filename + " into memory: read " +
                uint_to_string(bytes_read) + "; wanted " + uint_to_string(size));
        } else {
            throw std::runtime_error(
                std::string("premature eof reading file ") + filename + " into memory: read " +
                uint_to_string(bytes_read) + "; wanted " + uint_to_string(size));
        }
    }
}